

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O3

void __thiscall QMainWindowLayout::setCentralWidget(QMainWindowLayout *this,QWidget *widget)

{
  if (widget == (QWidget *)0x0) {
    if (*(long **)(this + 0x1c0) != (long *)0x0) {
      (**(code **)(**(long **)(this + 0x1c0) + 8))();
    }
    *(undefined8 *)(this + 0x1c0) = 0;
  }
  else {
    QLayout::addChildWidget((QLayout *)this,widget);
    QMainWindowLayoutState::setCentralWidget((QMainWindowLayoutState *)(this + 0x88),widget);
  }
  if ((*(int *)(this + 0x3c0) <= *(int *)(this + 0x3c8)) &&
     (*(int *)(this + 0x3c4) <= *(int *)(this + 0x3cc))) {
    *(undefined8 *)(this + 0x4f8) = *(undefined8 *)(this + 0x1c0);
    this[0x6dc] = (QMainWindowLayout)0x1;
  }
  (**(code **)(*(long *)this + 0x70))(this);
  return;
}

Assistant:

void QMainWindowLayout::setCentralWidget(QWidget *widget)
{
    if (widget != nullptr)
        addChildWidget(widget);
    layoutState.setCentralWidget(widget);
    if (savedState.isValid()) {
#if QT_CONFIG(dockwidget)
        savedState.dockAreaLayout.centralWidgetItem = layoutState.dockAreaLayout.centralWidgetItem;
        savedState.dockAreaLayout.fallbackToSizeHints = true;
#else
        savedState.centralWidgetItem = layoutState.centralWidgetItem;
#endif
    }
    invalidate();
}